

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_array_init(BigArray *array,void *buf,char *dtype,int ndim,size_t *dims,ptrdiff_t *strides)

{
  int iVar1;
  int local_3c;
  int i;
  ptrdiff_t *strides_local;
  size_t *dims_local;
  int ndim_local;
  char *dtype_local;
  void *buf_local;
  BigArray *array_local;
  
  memset(array,0,0x220);
  _dtype_normalize(array->dtype,dtype);
  array->data = buf;
  array->ndim = ndim;
  memset(array->dims,0,0x100);
  memset(array->strides,0,0x100);
  array->size = 1;
  for (local_3c = 0; local_3c < ndim; local_3c = local_3c + 1) {
    array->dims[local_3c] = dims[local_3c];
    array->size = dims[local_3c] * array->size;
  }
  if (strides == (ptrdiff_t *)0x0) {
    iVar1 = big_file_dtype_itemsize(dtype);
    array->strides[ndim + -1] = (long)iVar1;
    for (local_3c = ndim + -2; -1 < local_3c; local_3c = local_3c + -1) {
      array->strides[local_3c] = array->strides[local_3c + 1] * array->dims[local_3c + 1];
    }
  }
  else {
    for (local_3c = 0; local_3c < ndim; local_3c = local_3c + 1) {
      array->strides[local_3c] = strides[local_3c];
    }
  }
  return 0;
}

Assistant:

int
big_array_init(BigArray * array, void * buf, const char * dtype, int ndim, const size_t dims[], const ptrdiff_t strides[])
{

    memset(array, 0, sizeof(array[0]));

    _dtype_normalize(array->dtype, dtype);
    array->data = buf;
    array->ndim = ndim;
    int i;
    memset(array->dims, 0, sizeof(ptrdiff_t) * 32);
    memset(array->strides, 0, sizeof(ptrdiff_t) * 32);
    array->size = 1;
    for(i = 0; i < ndim; i ++) {
        array->dims[i] = dims[i];
        array->size *= dims[i];
    }
    if(strides != NULL) {
        for(i = 0; i < ndim; i ++) {
            array->strides[i] = strides[i];
        }
    } else {
        array->strides[ndim - 1] = big_file_dtype_itemsize(dtype);
        for(i = ndim - 2; i >= 0; i --) {
            array->strides[i] = array->strides[i + 1] * array->dims[i + 1];
        }
    }
    return 0;
}